

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArrayIndexEnumerator.cpp
# Opt level: O2

JavascriptString * __thiscall
Js::TypedArrayIndexEnumerator::MoveAndGetNext
          (TypedArrayIndexEnumerator *this,PropertyId *propertyId,PropertyAttributes *attributes)

{
  Type TVar1;
  ScriptContext *this_00;
  JavascriptString *pJVar2;
  uint value;
  
  *propertyId = -1;
  if (this->doneArray == false) {
    this_00 = (((((this->super_JavascriptEnumerator).super_RecyclableObject.type.ptr)->
                javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    TVar1 = this->index;
    value = TVar1 + 1;
    this->index = value;
    if (value < (((this->typedArrayObject).ptr)->super_ArrayBufferParent).super_ArrayObject.length)
    {
      if (attributes != (PropertyAttributes *)0x0) {
        *attributes = '\x01';
        value = this->index;
      }
      pJVar2 = ScriptContext::GetIntegerString(this_00,value);
      return pJVar2;
    }
    this->index = TVar1;
    this->doneArray = true;
  }
  return (JavascriptString *)0x0;
}

Assistant:

JavascriptString * TypedArrayIndexEnumerator::MoveAndGetNext(PropertyId& propertyId, PropertyAttributes* attributes)
    {
        // TypedArrayIndexEnumerator follows the same logic in JavascriptArrayEnumerator,
        // but the implementation is slightly different as we don't have sparse array
        // in typed array, and typed array is a DynamicObject instead of JavascriptArray.
        propertyId = Constants::NoProperty;
        ScriptContext *scriptContext = this->GetScriptContext();

        if (!doneArray)
        {
            while (true)
            {
                uint32 lastIndex = index;
                index++;
                if ((uint32)index >= typedArrayObject->GetLength()) // End of array
                {
                    index = lastIndex;
                    doneArray = true;
                    break;
                }

                if (attributes != nullptr)
                {
                    *attributes = PropertyEnumerable;
                }

                return scriptContext->GetIntegerString(index);
            }
        }
        return nullptr;
    }